

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

int call_init(lua_State *L,GCfunc *fn)

{
  uint uVar1;
  uint need_00;
  ulong uVar2;
  long in_RSI;
  long in_RDI;
  int need;
  int gotparams;
  int numparams;
  GCproto *pt;
  undefined4 local_48;
  MSize in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_20;
  
  if (*(char *)(in_RSI + 6) == '\0') {
    uVar2 = (ulong)*(uint *)(in_RSI + 0x10);
    uVar1 = (uint)*(byte *)(uVar2 - 0x3a);
    local_48 = (int)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) >> 3);
    need_00 = (uint)*(byte *)(uVar2 - 0x39);
    if ((*(byte *)(uVar2 - 0x1b) & 2) != 0) {
      need_00 = local_48 + 1 + need_00;
    }
    if ((long)((ulong)*(uint *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x18)) <=
        (long)((ulong)need_00 * 8)) {
      lj_state_growstack((lua_State *)(ulong)CONCAT14(*(byte *)(uVar2 - 0x3a),local_48),need_00);
    }
    local_48 = uVar1 - local_48;
    if (local_48 < 0) {
      local_48 = 0;
    }
    local_20 = local_48;
  }
  else {
    if ((long)((ulong)*(uint *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x18)) < 0xa1) {
      lj_state_growstack((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
    }
    local_20 = 0;
  }
  return local_20;
}

Assistant:

static int call_init(lua_State *L, GCfunc *fn)
{
  if (isluafunc(fn)) {
    GCproto *pt = funcproto(fn);
    int numparams = pt->numparams;
    int gotparams = (int)(L->top - L->base);
    int need = pt->framesize;
    if ((pt->flags & PROTO_VARARG)) need += 1+gotparams;
    lj_state_checkstack(L, (MSize)need);
    numparams -= gotparams;
    return numparams >= 0 ? numparams : 0;
  } else {
    lj_state_checkstack(L, LUA_MINSTACK);
    return 0;
  }
}